

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

LY_ERR ly_nested_ext_schema
                 (lyd_node *parent,lysc_node *sparent,char *prefix,size_t prefix_len,
                 LY_VALUE_FORMAT format,void *prefix_data,char *name,size_t name_len,
                 lysc_node **snode,lysc_ext_instance **ext)

{
  code *pcVar1;
  LY_ERR LVar2;
  lysc_ext_instance *local_80;
  lyplg_ext_data_snode_clb ext_snode_cb;
  lysc_ext_instance *nested_exts;
  uint64_t u;
  LY_ERR r;
  void *prefix_data_local;
  LY_VALUE_FORMAT format_local;
  size_t prefix_len_local;
  char *prefix_local;
  lysc_node *sparent_local;
  lyd_node *parent_local;
  
  ext_snode_cb = (lyplg_ext_data_snode_clb)0x0;
  if ((parent == (lyd_node *)0x0) || (parent->schema == (lysc_node *)0x0)) {
    if (sparent != (lysc_node *)0x0) {
      ext_snode_cb = (lyplg_ext_data_snode_clb)sparent->exts;
    }
  }
  else {
    ext_snode_cb = (lyplg_ext_data_snode_clb)parent->schema->exts;
  }
  nested_exts = (lysc_ext_instance *)0x0;
  do {
    if (ext_snode_cb == (lyplg_ext_data_snode_clb)0x0) {
      local_80 = (lysc_ext_instance *)0x0;
    }
    else {
      local_80 = *(lysc_ext_instance **)(ext_snode_cb + -8);
    }
    if (local_80 <= nested_exts) {
      return LY_ENOT;
    }
    if ((*(long *)(*(long *)(ext_snode_cb + (long)nested_exts * 0x48) + 0x18) != 0) &&
       (pcVar1 = *(code **)(*(long *)(*(long *)(ext_snode_cb + (long)nested_exts * 0x48) + 0x18) +
                           0x38), pcVar1 != (code *)0x0)) {
      LVar2 = (*pcVar1)(ext_snode_cb + (long)nested_exts * 0x48,parent,sparent,prefix,prefix_len,
                        format,prefix_data,name,name_len,snode);
      if (LVar2 == LY_SUCCESS) {
        if (ext != (lysc_ext_instance **)0x0) {
          *ext = (lysc_ext_instance *)(ext_snode_cb + (long)nested_exts * 0x48);
        }
        return LY_SUCCESS;
      }
      if (LVar2 != LY_ENOT) {
        return LVar2;
      }
    }
    nested_exts = (lysc_ext_instance *)((long)&nested_exts->def + 1);
  } while( true );
}

Assistant:

LY_ERR
ly_nested_ext_schema(const struct lyd_node *parent, const struct lysc_node *sparent, const char *prefix,
        size_t prefix_len, LY_VALUE_FORMAT format, void *prefix_data, const char *name, size_t name_len,
        const struct lysc_node **snode, struct lysc_ext_instance **ext)
{
    LY_ERR r;
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_ext_instance *nested_exts = NULL;
    lyplg_ext_data_snode_clb ext_snode_cb;

    /* check if there are any nested extension instances */
    if (parent && parent->schema) {
        nested_exts = parent->schema->exts;
    } else if (sparent) {
        nested_exts = sparent->exts;
    }
    LY_ARRAY_FOR(nested_exts, u) {
        if (!nested_exts[u].def->plugin) {
            /* no plugin */
            continue;
        }

        ext_snode_cb = nested_exts[u].def->plugin->snode;
        if (!ext_snode_cb) {
            /* not an extension with nested data */
            continue;
        }

        /* try to get the schema node */
        r = ext_snode_cb(&nested_exts[u], parent, sparent, prefix, prefix_len, format, prefix_data, name, name_len, snode);
        if (!r) {
            if (ext) {
                /* data successfully created, remember the ext instance */
                *ext = &nested_exts[u];
            }
            return LY_SUCCESS;
        } else if (r != LY_ENOT) {
            /* fatal error */
            return r;
        }
        /* data was not from this module, continue */
    }

    /* no extensions or none matched */
    return LY_ENOT;
}